

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (Texture2DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  FilterMode FVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int level;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  IVec2 layerRange;
  Vec2 local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  Vec2 local_40;
  int local_38;
  int local_34;
  
  iVar7 = 0;
  if (0 < texture->m_numLevels) {
    iVar7 = (texture->m_levels->m_size).m_data[2];
  }
  computeLayerRange((tcu *)&local_38,iVar7,(prec->coordBits).m_data[2],coord->m_data[2]);
  local_80.m_data = *(float (*) [2])coord->m_data;
  local_58 = *(undefined8 *)lodBounds->m_data;
  local_68 = (float)((ulong)local_58 >> 0x20);
  uStack_50 = 0;
  fVar1 = sampler->lodThreshold;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  fVar9 = ceilf((float)local_58 + 0.5);
  local_74 = (int)fVar9 + -1;
  fVar9 = floorf(local_68 + 0.5);
  local_78 = (int)fVar9;
  fVar9 = floorf((float)local_58);
  local_6c = (int)fVar9;
  fVar9 = floorf(local_68);
  local_70 = (int)fVar9;
  iVar7 = local_38;
  while ((iVar7 <= local_34 &&
         ((fVar1 < (float)local_58 ||
          (bVar2 = isLevelSampleResultValid
                             (texture->m_levels,sampler,sampler->magFilter,prec,&local_80,iVar7,
                              result), !bVar2))))) {
    if (fVar1 < local_68) {
      FVar4 = sampler->minFilter;
      iVar6 = texture->m_numLevels + -1;
      if (iVar6 < 1 || (FVar4 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
        if ((FVar4 == LINEAR_MIPMAP_NEAREST) || (FVar4 == NEAREST_MIPMAP_NEAREST)) {
          iVar8 = iVar6;
          if (local_74 < iVar6) {
            iVar8 = local_74;
          }
          if (local_74 < 0) {
            iVar8 = 0;
          }
          if (local_78 < iVar6) {
            iVar6 = local_78;
          }
          if (local_78 < 0) {
            iVar6 = 0;
          }
          while (iVar8 <= iVar6) {
            uVar3 = sampler->minFilter - LINEAR;
            FVar4 = NEAREST;
            if (uVar3 < 5) {
              FVar4 = *(FilterMode *)(&DAT_00608af0 + (ulong)uVar3 * 4);
            }
            bVar2 = isLevelSampleResultValid
                              (texture->m_levels + iVar8,sampler,FVar4,prec,&local_80,iVar7,result);
            iVar8 = iVar8 + 1;
            if (bVar2) goto LAB_0057158d;
          }
        }
        else {
          bVar2 = isLevelSampleResultValid
                            (texture->m_levels,sampler,FVar4,prec,&local_80,iVar7,result);
          if (bVar2) break;
        }
      }
      else {
        iVar8 = texture->m_numLevels + -2;
        iVar6 = iVar8;
        if (local_6c < iVar8) {
          iVar6 = local_6c;
        }
        if (local_6c < 0) {
          iVar6 = 0;
        }
        if (local_70 < iVar8) {
          iVar8 = local_70;
        }
        if (local_70 < 0) {
          iVar8 = 0;
        }
        while (iVar6 <= iVar8) {
          uVar3 = sampler->minFilter - LINEAR;
          FVar4 = NEAREST;
          if (uVar3 < 5) {
            FVar4 = *(FilterMode *)(&DAT_00608af0 + (ulong)uVar3 * 4);
          }
          fVar9 = (float)iVar6;
          auVar10._4_4_ = local_58._4_4_ - fVar9;
          auVar10._0_4_ = (float)local_58 - fVar9;
          auVar10._8_4_ = (float)uStack_50 - fVar9;
          auVar10._12_4_ = uStack_50._4_4_ - fVar9;
          auVar10 = minps(_DAT_005a2880,auVar10);
          lVar5 = (long)iVar6;
          iVar6 = iVar6 + 1;
          local_40.m_data[1] = (float)(-(uint)(0.0 <= local_58._4_4_ - fVar9) & auVar10._4_4_);
          local_40.m_data[0] = (float)(-(uint)(0.0 <= (float)local_58 - fVar9) & auVar10._0_4_);
          bVar2 = isMipmapLinearSampleResultValid
                            (texture->m_levels + lVar5,texture->m_levels + iVar6,sampler,FVar4,prec,
                             &local_80,iVar7,&local_40,result);
          if (bVar2) goto LAB_0057158d;
        }
      }
    }
    iVar7 = iVar7 + 1;
  }
LAB_0057158d:
  return iVar7 <= local_34;
}

Assistant:

bool isLookupResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.z(), coord.z());
	const Vec2		coordXY			= coord.swizzle(0,1);
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordXY, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordXY, layer, result))
					return true;
			}
		}
	}

	return false;
}